

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O2

void __thiscall Interface::print_groups(Interface *this,ofstream *out)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int j;
  long lVar6;
  long lVar7;
  long lVar8;
  Group g;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    for (lVar8 = 0;
        lVar8 < (int)(((long)(this->plane).f.groups.
                             super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->plane).f.groups.super__Vector_base<Group,_std::allocator<Group>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar8 = lVar8 + 1) {
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      std::vector<Point,_std::allocator<Point>_>::vector
                (&g.points,
                 &(this->plane).f.groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8].points);
      lVar7 = 0;
      lVar6 = 0;
      while( true ) {
        if ((int)(((long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= lVar6) break;
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->x + lVar7));
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->y + lVar7));
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        std::endl<char,std::char_traits<char>>(poVar5);
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x18;
      }
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
    }
    std::ofstream::close();
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Errors in opening");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void Interface::print_groups(ofstream &out) {
    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) plane.f.groups.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Group g = plane.f.groups[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c
                    << " " << endl;
            }


        }
        out.close();
    }
}